

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,ExternalRef *name)

{
  size_type sVar1;
  string local_58;
  string local_38;
  
  sVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(&this->import_syms_,name->name);
  if (sVar1 == 0) {
    GetGlobalName(&local_58,this,name->name);
    WriteData(this,local_58._M_dataplus._M_p,local_58._M_string_length);
  }
  else {
    GetGlobalName(&local_38,this,name->name);
    Deref(&local_58,&local_38);
    WriteData(this,local_58._M_dataplus._M_p,local_58._M_string_length);
    std::__cxx11::string::_M_dispose();
  }
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void CWriter::Write(const ExternalRef& name) {
  bool is_import = import_syms_.count(name.name) != 0;
  if (is_import) {
    Write(Deref(GetGlobalName(name.name)));
  } else {
    Write(GetGlobalName(name.name));
  }
}